

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
::erase(base_checker<phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
        *this,iterator iter)

{
  _Base_ptr p_Var1;
  size_type sVar2;
  iterator __position;
  int iVar3;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar4;
  char *pcVar5;
  iterator iVar6;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  bVar7;
  iterator iVar8;
  AssertionResult gtest_ar;
  key_type key;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  undefined1 local_60 [8];
  int local_58;
  undefined4 uStack_54;
  int local_4c;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_48;
  size_type local_40;
  size_type local_38;
  
  pbVar4 = iter.node;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    iVar3 = iter.position;
    local_4c = *(int *)(pbVar4 + (long)iVar3 * 8 + 0xc);
    local_40 = (this->tree_).
               super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
               .
               super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
               .tree_.size_;
    local_38 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               ::count_multi<int>((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                                   *)this,&local_4c);
    __position._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var1 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < local_4c]) {
      if (local_4c <= (int)p_Var1[1]._M_color) {
        __position._M_node = p_Var1;
      }
    }
    iVar6 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
            ::lower_bound<int>((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                                *)this,&local_4c);
    local_60 = (undefined1  [8])iVar6.node;
    local_58 = iVar6.position;
    if (local_58 != iVar3 || local_60 != (undefined1  [8])pbVar4) {
      do {
        do {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
          ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                       *)local_60);
        } while (local_60 != (undefined1  [8])pbVar4);
      } while (local_58 != iVar3);
    }
    local_48._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)&this->checker_,__position);
    iVar6._12_4_ = 0;
    iVar6.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                  *)SUB128(iter._0_12_,0);
    iVar6.position = SUB124(iter._0_12_,8);
    iVar6 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
            ::erase((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                     *)this,iVar6);
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->tree_).
         super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
         .
         super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
         .tree_.size_;
    local_68.data_ =
         (AssertHelperData *)(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_60,"tree_.size()","(size_t)checker_.size()",
               (unsigned_long *)&local_70,(unsigned_long *)&local_68);
    sVar2 = local_38;
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)CONCAT44(uStack_54,local_58) == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)CONCAT44(uStack_54,local_58);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0xea,pcVar5);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_54,local_58) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_54,local_58));
    }
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->tree_).
         super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
         .
         super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
         .tree_.size_;
    local_68.data_ = (AssertHelperData *)(local_40 - 1);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_60,"tree_.size()","size - 1",(unsigned_long *)&local_70,
               (unsigned_long *)&local_68);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)CONCAT44(uStack_54,local_58) == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)CONCAT44(uStack_54,local_58);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0xeb,pcVar5);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_54,local_58) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_54,local_58));
    }
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
         ::count_multi<int>((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                             *)this,&local_4c);
    local_68.data_ = (AssertHelperData *)(sVar2 - 1);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_60,"tree_.count(key)","count - 1",(unsigned_long *)&local_70,
               (unsigned_long *)&local_68);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)CONCAT44(uStack_54,local_58) == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)CONCAT44(uStack_54,local_58);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0xec,pcVar5);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_54,local_58) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_54,local_58));
    }
    if (sVar2 == 1) {
      erase_check(this,&local_4c);
    }
    bVar7._12_4_ = 0;
    bVar7.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                  *)SUB128(iVar6._0_12_,0);
    bVar7.position = SUB124(iVar6._0_12_,8);
    bVar7 = base_checker<phmap::btree_multimap<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            ::
            iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,std::_Rb_tree_iterator<std::pair<int_const,int>>>
                      ((base_checker<phmap::btree_multimap<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                        *)this,bVar7,local_48);
    iVar8.node = bVar7.node;
    iVar8.position = bVar7.position;
    iVar8._12_4_ = bVar7._12_4_;
    return iVar8;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
               );
}

Assistant:

iterator erase(iterator iter) {
        key_type key = iter.key();
        size_t size = tree_.size();
        size_t count = tree_.count(key);
        auto checker_iter = checker_.lower_bound(key);
        for (iterator tmp(tree_.lower_bound(key)); tmp != iter; ++tmp) {
            ++checker_iter;
        }
        auto checker_next = checker_iter;
        ++checker_next;
        checker_.erase(checker_iter);
        iter = tree_.erase(iter);
        EXPECT_EQ(tree_.size(), (size_t)checker_.size());
        EXPECT_EQ(tree_.size(), size - 1);
        EXPECT_EQ(tree_.count(key), count - 1);
        if (count == 1) {
            erase_check(key);
        }
        return iter_check(iter, checker_next);
    }